

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::copyTexSubImage2D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int yoffset,int x,int y,
          int width,int height)

{
  pointer pTVar1;
  CubeFace CVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Texture2D *pTVar6;
  TextureCube *pTVar7;
  int iVar8;
  bool bVar9;
  MultisampleConstPixelBufferAccess src;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess local_90;
  ConstPixelBufferAccess local_68;
  
  iVar3 = this->m_activeTexture;
  pTVar1 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&local_68,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&local_90,(MultisamplePixelBufferAccess *)&local_68);
  if ((-1 < (yoffset | xoffset)) && (-1 < (height | width))) {
    if ((local_90.m_access.m_size.m_data[0] == 0) ||
       ((local_90.m_access.m_size.m_data[1] == 0 || (local_90.m_access.m_size.m_data[2] == 0)))) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    if (target == 0xde1) {
      pTVar6 = &pTVar1[iVar3].default2DTex;
      if (pTVar1[iVar3].tex2DBinding != (Texture2D *)0x0) {
        pTVar6 = pTVar1[iVar3].tex2DBinding;
      }
      if ((((uint)level < 0xe) &&
          (*(long *)((long)((pTVar6->m_levels).m_data + (uint)level) + 8) != 0)) &&
         ((tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                     (&local_68,
                      &(pTVar6->m_levels).m_access[(uint)level].super_ConstPixelBufferAccess),
          xoffset + width <= local_68.m_size.m_data[0] &&
          (yoffset + height <= local_68.m_size.m_data[1])))) {
        iVar3 = 0;
        if (width < 1) {
          width = iVar3;
        }
        if (height < 1) {
          height = iVar3;
        }
        for (; iVar3 != height; iVar3 = iVar3 + 1) {
          iVar5 = x;
          iVar8 = xoffset;
          iVar4 = width;
          while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
            if ((((-1 < iVar5) && (iVar5 < local_90.m_access.m_size.m_data[1])) && (-1 < iVar3 + y))
               && (iVar3 + y < local_90.m_access.m_size.m_data[2])) {
              rr::resolveMultisamplePixel
                        ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                         (int)&local_90,iVar5);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_68,(Vec4 *)&stack0xffffffffffffffc0,iVar8,
                         iVar3 + yoffset,0);
            }
            iVar5 = iVar5 + 1;
            iVar8 = iVar8 + 1;
          }
        }
        return;
      }
    }
    else {
      if (5 < target - 0x8515) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      if ((uint)level < 0xe) {
        CVar2 = mapGLCubeFace(target);
        pTVar7 = &pTVar1[iVar3].defaultCubeTex;
        if (pTVar1[iVar3].texCubeBinding != (TextureCube *)0x0) {
          pTVar7 = pTVar1[iVar3].texCubeBinding;
        }
        if (((*(long *)((long)(pTVar7->m_levels[CVar2].m_data + (uint)level) + 8) != 0) &&
            (tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                       (&local_68,
                        &pTVar7->m_levels[CVar2].m_access[(uint)level].super_ConstPixelBufferAccess)
            , xoffset + width <= local_68.m_size.m_data[0])) &&
           (yoffset + height <= local_68.m_size.m_data[1])) {
          iVar3 = 0;
          if (width < 1) {
            width = iVar3;
          }
          if (height < 1) {
            height = iVar3;
          }
          for (; iVar3 != height; iVar3 = iVar3 + 1) {
            iVar5 = x;
            iVar8 = xoffset;
            iVar4 = width;
            while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
              if (((-1 < iVar5) && (iVar5 < local_90.m_access.m_size.m_data[1])) &&
                 ((-1 < iVar3 + y && (iVar3 + y < local_90.m_access.m_size.m_data[2])))) {
                rr::resolveMultisamplePixel
                          ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                           (int)&local_90,iVar5);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_68,(Vec4 *)&stack0xffffffffffffffc0,iVar8,
                           iVar3 + yoffset,0);
              }
              iVar5 = iVar5 + 1;
              iVar8 = iVar8 + 1;
            }
          }
          return;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexSubImage2D (deUint32 target, int level, int xoffset, int yoffset, int x, int y, int width, int height)
{
	TextureUnit&							unit	= m_textureUnits[m_activeTexture];
	rr::MultisampleConstPixelBufferAccess	src		= getReadColorbuffer();

	RC_IF_ERROR(xoffset < 0 || yoffset < 0,					GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0,					GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src),								GL_INVALID_OPERATION, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth() ||
					yoffset + height	> dst.getHeight(),
					GL_INVALID_VALUE, RC_RET_VOID);

		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo+xoffset, yo+yoffset);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		TextureCube&	texture		= unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;
		tcu::CubeFace	face		= mapGLCubeFace(target);

		RC_IF_ERROR(!texture.hasFace(level, face), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getFace(level, face);

		RC_IF_ERROR(xoffset + width		> dst.getWidth() ||
					yoffset + height	> dst.getHeight(),
					GL_INVALID_VALUE, RC_RET_VOID);

		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo+xoffset, yo+yoffset);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}